

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

size_t al_fwrite32le(ALLEGRO_FILE *f,int32_t l)

{
  uint uVar1;
  uint uVar2;
  undefined8 uStack_20;
  
  uVar1 = al_fputc(f,l & 0xffU);
  if (uVar1 == (l & 0xffU)) {
    uVar2 = (uint)l >> 8 & 0xff;
    uVar1 = al_fputc(f,uVar2);
    if (uVar1 == uVar2) {
      uVar2 = (uint)l >> 0x10 & 0xff;
      uVar1 = al_fputc(f,uVar2);
      if (uVar1 == uVar2) {
        uVar1 = al_fputc(f,(uint)l >> 0x18);
        uStack_20 = (ulong)(uVar1 == (uint)l >> 0x18) + 3;
      }
      else {
        uStack_20 = 2;
      }
    }
    else {
      uStack_20 = 1;
    }
  }
  else {
    uStack_20 = 0;
  }
  return uStack_20;
}

Assistant:

size_t al_fwrite32le(ALLEGRO_FILE *f, int32_t l)
{
   uint8_t b1, b2, b3, b4;
   ASSERT(f);

   b1 = ((l & 0xFF000000L) >> 24);
   b2 = ((l & 0x00FF0000L) >> 16);
   b3 = ((l & 0x0000FF00L) >> 8);
   b4 = l & 0x00FF;

   if (al_fputc(f, b4) == b4) {
      if (al_fputc(f, b3) == b3) {
         if (al_fputc(f, b2) == b2) {
            if (al_fputc(f, b1) == b1) {
               return 4;
            }
            return 3;
         }
         return 2;
      }
      return 1;
   }
   return 0;
}